

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::PIQBase::VerifyGetProgramResourceLocation
          (PIQBase *this,GLuint program,GLenum programInterface,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *locations,string *name,long *error)

{
  uint uVar1;
  bool bVar2;
  GLchar *name_00;
  pointer ppVar3;
  uint *puVar4;
  _Self local_48;
  _Self local_40;
  iterator it;
  GLint res;
  long *error_local;
  string *name_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *locations_local;
  GLenum programInterface_local;
  GLuint program_local;
  PIQBase *this_local;
  
  name_00 = (GLchar *)std::__cxx11::string::c_str();
  it._M_node._4_4_ =
       glu::CallLogWrapper::glGetProgramResourceLocation
                 (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,
                  programInterface,name_00);
  if ((int)it._M_node._4_4_ < 0) {
    anon_unknown_0::Output("ERROR: Got %d, expected not less than 0\n",(ulong)it._M_node._4_4_);
    *error = -1;
  }
  else {
    local_40._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::begin(locations);
    while( true ) {
      local_48._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::end(locations);
      bVar2 = std::operator!=(&local_40,&local_48);
      uVar1 = it._M_node._4_4_;
      if (!bVar2) break;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
               ::operator->(&local_40);
      if (ppVar3->second == it._M_node._4_4_) {
        anon_unknown_0::Output("ERROR: Duplicated value found: %d\n",(ulong)it._M_node._4_4_);
        *error = -1;
        return;
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
      ::operator++(&local_40);
    }
    puVar4 = (uint *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](locations,name);
    *puVar4 = uVar1;
  }
  return;
}

Assistant:

virtual inline void VerifyGetProgramResourceLocation(GLuint program, GLenum		   programInterface,
														 std::map<std::string, GLint>& locations,
														 const std::string& name, long& error)
	{
		GLint res = glGetProgramResourceLocation(program, programInterface, name.c_str());
		if (res < 0)
		{
			Output("ERROR: Got %d, expected not less than 0\n", res);
			error = ERROR;
			return;
		}
		std::map<std::string, GLint>::iterator it = locations.begin();
		while (it != locations.end())
		{
			if (it->second == res)
			{
				Output("ERROR: Duplicated value found: %d\n", res);
				error = ERROR;
				return;
			}
			++it;
		}
		locations[name] = res;
	}